

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O3

void TestCompare(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Vector<const_char> value_06;
  Vector<const_char> value_07;
  Vector<const_char> value_08;
  Vector<const_char> value_09;
  Vector<const_char> value_10;
  Vector<const_char> value_11;
  Vector<const_char> value_12;
  Vector<const_char> value_13;
  Vector<const_char> value_14;
  Vector<const_char> value_15;
  Vector<const_char> value_16;
  Bignum bignum2;
  Bignum bignum1;
  Bignum local_420;
  Bignum local_21c;
  
  local_21c.used_bigits_ = 0;
  local_21c.exponent_ = 0;
  local_420.used_bigits_ = 0;
  local_420.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&local_21c,1);
  double_conversion::Bignum::AssignUInt16(&local_420,1);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != 0) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x431;
    goto LAB_00825869;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != 0) {
    pcVar4 = "Bignum::Equal(bignum1, bignum2)";
    uVar3 = 0x432;
LAB_008254df:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar3,pcVar4);
    abort();
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (0 < iVar1) {
    pcVar4 = "Bignum::LessEqual(bignum1, bignum2)";
    uVar3 = 0x433;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 < 0) {
    pcVar4 = "!Bignum::Less(bignum1, bignum2)";
    uVar3 = 0x434;
    goto LAB_008254df;
  }
  double_conversion::Bignum::AssignUInt16(&local_21c,0);
  double_conversion::Bignum::AssignUInt16(&local_420,1);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != -1) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x438;
    goto LAB_008258e1;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 != 1) {
    pcVar4 = "Bignum::Compare(bignum2, bignum1)";
    uVar3 = 0x439;
    goto LAB_0082590d;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 == 0) {
    pcVar4 = "!Bignum::Equal(bignum1, bignum2)";
    uVar3 = 0x43a;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 == 0) {
    pcVar4 = "!Bignum::Equal(bignum2, bignum1)";
    uVar3 = 0x43b;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (0 < iVar1) {
    pcVar4 = "Bignum::LessEqual(bignum1, bignum2)";
    uVar3 = 0x43c;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 < 1) {
    pcVar4 = "!Bignum::LessEqual(bignum2, bignum1)";
    uVar3 = 0x43d;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (-1 < iVar1) {
    pcVar4 = "Bignum::Less(bignum1, bignum2)";
    uVar3 = 0x43e;
    goto LAB_008254df;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 < 0) {
    pcVar4 = "!Bignum::Less(bignum2, bignum1)";
    uVar3 = 0x43f;
    goto LAB_008254df;
  }
  value._8_8_ = 0x15;
  value.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_21c,value);
  value_00._8_8_ = 0x15;
  value_00.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_420,value_00);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != 0) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x443;
    goto LAB_00825869;
  }
  value_01._8_8_ = 0x15;
  value_01.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_21c,value_01);
  value_02._8_8_ = 0x15;
  value_02.start_ = "1234567890ABCDEF12346";
  double_conversion::Bignum::AssignHexString(&local_420,value_02);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != -1) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x447;
    goto LAB_008258e1;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 != 1) {
    pcVar4 = "Bignum::Compare(bignum2, bignum1)";
    uVar3 = 0x448;
    goto LAB_0082590d;
  }
  value_03._8_8_ = 0x15;
  value_03.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_21c,value_03);
  double_conversion::Bignum::ShiftLeft(&local_21c,500);
  value_04._8_8_ = 0x15;
  value_04.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_420,value_04);
  double_conversion::Bignum::ShiftLeft(&local_420,500);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != 0) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x44e;
    goto LAB_00825869;
  }
  value_05._8_8_ = 0x15;
  value_05.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_21c,value_05);
  double_conversion::Bignum::ShiftLeft(&local_21c,500);
  value_06._8_8_ = 0x15;
  value_06.start_ = "1234567890ABCDEF12346";
  double_conversion::Bignum::AssignHexString(&local_420,value_06);
  double_conversion::Bignum::ShiftLeft(&local_420,500);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 != -1) {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x454;
    goto LAB_008258e1;
  }
  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
  if (iVar1 != 1) {
    pcVar4 = "Bignum::Compare(bignum2, bignum1)";
    uVar3 = 0x455;
    goto LAB_0082590d;
  }
  double_conversion::Bignum::AssignUInt16(&local_21c,1);
  double_conversion::Bignum::ShiftLeft(&local_21c,0x40);
  value_07._8_8_ = 0x11;
  value_07.start_ = "10000000000000000";
  double_conversion::Bignum::AssignHexString(&local_420,value_07);
  iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
  if (iVar1 == 0) {
    iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
    if (iVar1 == 0) {
      double_conversion::Bignum::AssignUInt16(&local_21c,1);
      double_conversion::Bignum::ShiftLeft(&local_21c,0x40);
      value_08._8_8_ = 0x11;
      value_08.start_ = "10000000000000001";
      double_conversion::Bignum::AssignHexString(&local_420,value_08);
      iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
      if (iVar1 == -1) {
        iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
        if (iVar1 == 1) {
          double_conversion::Bignum::AssignUInt16(&local_21c,1);
          double_conversion::Bignum::ShiftLeft(&local_21c,0x60);
          value_09._8_8_ = 0x11;
          value_09.start_ = "10000000000000001";
          double_conversion::Bignum::AssignHexString(&local_420,value_09);
          double_conversion::Bignum::ShiftLeft(&local_420,0x20);
          iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
          if (iVar1 != -1) {
            pcVar4 = "Bignum::Compare(bignum1, bignum2)";
            uVar3 = 0x467;
            goto LAB_008258e1;
          }
          iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
          if (iVar1 == 1) {
            value_10._8_8_ = 0x10;
            value_10.start_ = "FFFFFFFFFFFFFFFF";
            double_conversion::Bignum::AssignHexString(&local_21c,value_10);
            double_conversion::Bignum::AssignUInt16(&local_420,1);
            double_conversion::Bignum::ShiftLeft(&local_420,0x40);
            iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
            if (iVar1 != -1) {
              pcVar4 = "Bignum::Compare(bignum1, bignum2)";
              uVar3 = 0x46d;
              goto LAB_008258e1;
            }
            iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
            if (iVar1 == 1) {
              value_11._8_8_ = 0x10;
              value_11.start_ = "FFFFFFFFFFFFFFFF";
              double_conversion::Bignum::AssignHexString(&local_21c,value_11);
              double_conversion::Bignum::ShiftLeft(&local_21c,0x20);
              double_conversion::Bignum::AssignUInt16(&local_420,1);
              double_conversion::Bignum::ShiftLeft(&local_420,0x60);
              iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
              if (iVar1 != -1) {
                pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                uVar3 = 0x474;
                goto LAB_008258e1;
              }
              iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
              if (iVar1 == 1) {
                value_12._8_8_ = 0x10;
                value_12.start_ = "FFFFFFFFFFFFFFFF";
                double_conversion::Bignum::AssignHexString(&local_21c,value_12);
                double_conversion::Bignum::ShiftLeft(&local_21c,0x20);
                double_conversion::Bignum::AssignUInt16(&local_420,1);
                double_conversion::Bignum::ShiftLeft(&local_420,0x5f);
                iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
                if (iVar1 == 1) {
                  iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
                  if (iVar1 == -1) {
                    value_13._8_8_ = 0x10;
                    value_13.start_ = "FFFFFFFFFFFFFFFF";
                    double_conversion::Bignum::AssignHexString(&local_21c,value_13);
                    double_conversion::Bignum::ShiftLeft(&local_21c,0x20);
                    double_conversion::Bignum::AssignUInt16(&local_420,1);
                    double_conversion::Bignum::ShiftLeft(&local_420,100);
                    iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
                    if (iVar1 == -1) {
                      iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
                      if (iVar1 != 1) {
                        pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                        uVar3 = 0x483;
                        goto LAB_0082590d;
                      }
                      value_14._8_8_ = 0xf;
                      value_14.start_ = "100000000000000";
                      double_conversion::Bignum::AssignHexString(&local_21c,value_14);
                      double_conversion::Bignum::AssignUInt16(&local_420,1);
                      double_conversion::Bignum::ShiftLeft(&local_420,0x38);
                      iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
                      if (iVar1 == 0) {
                        iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
                        if (iVar1 == 0) {
                          value_15._8_8_ = 0xf;
                          value_15.start_ = "100000000000001";
                          double_conversion::Bignum::AssignHexString(&local_21c,value_15);
                          double_conversion::Bignum::AssignUInt16(&local_420,1);
                          double_conversion::Bignum::ShiftLeft(&local_420,0x38);
                          iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
                          if (iVar1 != 1) {
                            pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                            uVar3 = 0x48e;
                            goto LAB_0082590d;
                          }
                          iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
                          if (iVar1 == -1) {
                            value_16._8_8_ = 0xf;
                            value_16.start_ = "200000000000000";
                            double_conversion::Bignum::AssignHexString(&local_21c,value_16);
                            double_conversion::Bignum::AssignUInt16(&local_420,3);
                            double_conversion::Bignum::ShiftLeft(&local_420,0x38);
                            iVar1 = double_conversion::Bignum::Compare(&local_21c,&local_420);
                            if (iVar1 == -1) {
                              iVar1 = double_conversion::Bignum::Compare(&local_420,&local_21c);
                              if (iVar1 == 1) {
                                return;
                              }
                              pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                              uVar3 = 0x495;
                              goto LAB_0082590d;
                            }
                            pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                            uVar3 = 0x494;
                          }
                          else {
                            pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                            uVar3 = 0x48f;
                          }
                          goto LAB_008258e1;
                        }
                        pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                        uVar3 = 0x489;
                      }
                      else {
                        pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                        uVar3 = 0x488;
                      }
                      goto LAB_00825869;
                    }
                    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                    uVar3 = 0x482;
                  }
                  else {
                    pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                    uVar3 = 0x47c;
                  }
                  goto LAB_008258e1;
                }
                pcVar4 = "Bignum::Compare(bignum1, bignum2)";
                uVar3 = 0x47b;
              }
              else {
                pcVar4 = "Bignum::Compare(bignum2, bignum1)";
                uVar3 = 0x475;
              }
            }
            else {
              pcVar4 = "Bignum::Compare(bignum2, bignum1)";
              uVar3 = 0x46e;
            }
          }
          else {
            pcVar4 = "Bignum::Compare(bignum2, bignum1)";
            uVar3 = 0x468;
          }
        }
        else {
          pcVar4 = "Bignum::Compare(bignum2, bignum1)";
          uVar3 = 0x461;
        }
LAB_0082590d:
        pcVar2 = "+1";
        uVar5 = 1;
      }
      else {
        pcVar4 = "Bignum::Compare(bignum1, bignum2)";
        uVar3 = 0x460;
LAB_008258e1:
        pcVar2 = "-1";
        uVar5 = 0xffffffff;
      }
      goto LAB_00825913;
    }
    pcVar4 = "Bignum::Compare(bignum2, bignum1)";
    uVar3 = 0x45b;
  }
  else {
    pcVar4 = "Bignum::Compare(bignum1, bignum2)";
    uVar3 = 0x45a;
  }
LAB_00825869:
  pcVar2 = "0";
  uVar5 = 0;
LAB_00825913:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar3,pcVar2,pcVar4,uVar5,iVar1);
  abort();
}

Assistant:

TEST(Compare) {
  Bignum bignum1;
  Bignum bignum2;
  bignum1.AssignUInt16(1);
  bignum2.AssignUInt16(1);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK(Bignum::Equal(bignum1, bignum2));
  CHECK(Bignum::LessEqual(bignum1, bignum2));
  CHECK(!Bignum::Less(bignum1, bignum2));

  bignum1.AssignUInt16(0);
  bignum2.AssignUInt16(1);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));
  CHECK(!Bignum::Equal(bignum1, bignum2));
  CHECK(!Bignum::Equal(bignum2, bignum1));
  CHECK(Bignum::LessEqual(bignum1, bignum2));
  CHECK(!Bignum::LessEqual(bignum2, bignum1));
  CHECK(Bignum::Less(bignum1, bignum2));
  CHECK(!Bignum::Less(bignum2, bignum1));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  AssignHexString(&bignum2, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  AssignHexString(&bignum2, "1234567890ABCDEF12346");
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  bignum1.ShiftLeft(500);
  AssignHexString(&bignum2, "1234567890ABCDEF12345");
  bignum2.ShiftLeft(500);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  bignum1.ShiftLeft(500);
  AssignHexString(&bignum2, "1234567890ABCDEF12346");
  bignum2.ShiftLeft(500);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(64);
  AssignHexString(&bignum2, "10000000000000000");
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(0, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(64);
  AssignHexString(&bignum2, "10000000000000001");
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(96);
  AssignHexString(&bignum2, "10000000000000001");
  bignum2.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(64);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(96);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(95);
  CHECK_EQ(+1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(-1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(100);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "100000000000000");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(0, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "100000000000001");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(+1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(-1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "200000000000000");
  bignum2.AssignUInt16(3);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));
}